

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraphNode.h
# Opt level: O3

void __thiscall
dg::SubgraphNode<dg::pta::PSNode>::_removeThisFromSuccessorsPredecessors
          (SubgraphNode<dg::pta::PSNode> *this,PSNode *succ)

{
  pointer ppPVar1;
  pointer ppPVar2;
  pointer ppPVar3;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> tmp;
  PSNode *p;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> local_58;
  PSNode *local_38;
  
  local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::reserve
            (&local_58,
             (long)(succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
                   super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
                   super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl
                   .super__Vector_impl_data._M_start >> 3);
  ppPVar3 = (succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppPVar2 = (succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppPVar3 != ppPVar2) {
    do {
      local_38 = *ppPVar3;
      if (local_38 == (PSNode *)0x0 || &local_38->super_SubgraphNode<dg::pta::PSNode> != this) {
        if (local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>::
          _M_realloc_insert<dg::pta::PSNode*const&>
                    ((vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>> *)&local_58,
                     (iterator)
                     local_58.
                     super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_38);
        }
        else {
          *local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = local_38;
          local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl
          .super__Vector_impl_data._M_finish =
               local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      ppPVar3 = ppPVar3 + 1;
    } while (ppPVar3 != ppPVar2);
    ppPVar3 = (succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppPVar2 = (succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
              super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  ppPVar1 = (succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  (succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (succ->super_SubgraphNode<dg::pta::PSNode>)._predecessors.
  super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  if (ppPVar3 != (pointer)0x0) {
    local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = ppPVar3;
    local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppPVar2;
    local_58.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = ppPVar1;
    operator_delete(ppPVar3,(long)ppPVar1 - (long)ppPVar3);
  }
  return;
}

Assistant:

void _removeThisFromSuccessorsPredecessors(NodeT *succ) {
        std::vector<NodeT *> tmp;
        tmp.reserve(succ->predecessorsNum());
        for (NodeT *p : succ->_predecessors) {
            if (p != this)
                tmp.push_back(p);
        }

        succ->_predecessors.swap(tmp);
    }